

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

wchar_t read_mtree(archive_read *a,mtree *mtree)

{
  int iVar1;
  ushort **ppuVar2;
  bool bVar3;
  wchar_t local_58;
  wchar_t local_54;
  wchar_t is_form_d;
  wchar_t r;
  mtree_entry *last_entry;
  mtree_option *global;
  char *s;
  char *p;
  uintmax_t counter;
  ssize_t len;
  mtree *mtree_local;
  archive_read *a_local;
  
  mtree->archive_format = L'\x00080000';
  mtree->archive_format_name = "mtree";
  last_entry = (mtree_entry *)0x0;
  _is_form_d = (mtree_entry *)0x0;
  len = (ssize_t)mtree;
  mtree_local = (mtree *)a;
  detect_form(a,&local_58);
  p = (char *)0x1;
  do {
    local_54 = 0;
    counter = readline((archive_read *)mtree_local,(mtree *)len,&s,0x10000);
    if (counter == 0) {
      *(undefined8 *)(len + 0x48) = *(undefined8 *)(len + 0x40);
      free_options((mtree_option *)last_entry);
      return L'\0';
    }
    if ((long)counter < 0) {
      free_options((mtree_option *)last_entry);
      return (wchar_t)counter;
    }
    while( true ) {
      bVar3 = true;
      if (*s != ' ') {
        bVar3 = *s == '\t';
      }
      if (!bVar3) break;
      s = s + 1;
      counter = counter - 1;
    }
    if ((((*s != '#') && (*s != '\r')) && (*s != '\n')) && (*s != '\0')) {
      for (global = (mtree_option *)s; global < (mtree_option *)(s + (counter - 1));
          global = (mtree_option *)((long)&global->next + 1)) {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)(uint)*(byte *)&global->next] & 0x4000) == 0) {
          local_54 = -0x1e;
          break;
        }
      }
      if (local_54 != 0) goto LAB_0018a1b9;
      if (*s == '/') {
        if (((long)counter < 5) || (iVar1 = strncmp(s,"/set",4), iVar1 != 0)) {
          if ((((long)counter < 7) || (iVar1 = strncmp(s,"/unset",6), iVar1 != 0)) ||
             ((s[6] != ' ' && (s[6] != '\t')))) goto LAB_0018a1b9;
          local_54 = process_global_unset
                               ((archive_read *)mtree_local,(mtree_option **)&last_entry,s);
        }
        else {
          if ((s[4] != ' ') && (s[4] != '\t')) {
LAB_0018a1b9:
            archive_set_error((archive *)mtree_local,0x54,"Can\'t parse line %ju",p);
            free_options((mtree_option *)last_entry);
            return L'\xffffffe2';
          }
          local_54 = process_global_set((archive_read *)mtree_local,(mtree_option **)&last_entry,s);
        }
      }
      else {
        local_54 = process_add_entry((archive_read *)mtree_local,(mtree *)len,
                                     (mtree_option **)&last_entry,s,counter,
                                     (mtree_entry **)&is_form_d,local_58);
      }
      if (local_54 != L'\0') {
        free_options((mtree_option *)last_entry);
        return local_54;
      }
    }
    p = p + 1;
  } while( true );
}

Assistant:

static int
read_mtree(struct archive_read *a, struct mtree *mtree)
{
	ssize_t len;
	uintmax_t counter;
	char *p, *s;
	struct mtree_option *global;
	struct mtree_entry *last_entry;
	int r, is_form_d;

	mtree->archive_format = ARCHIVE_FORMAT_MTREE;
	mtree->archive_format_name = "mtree";

	global = NULL;
	last_entry = NULL;

	(void)detect_form(a, &is_form_d);

	for (counter = 1; ; ++counter) {
		r = ARCHIVE_OK;
		len = readline(a, mtree, &p, 65536);
		if (len == 0) {
			mtree->this_entry = mtree->entries;
			free_options(global);
			return (ARCHIVE_OK);
		}
		if (len < 0) {
			free_options(global);
			return ((int)len);
		}
		/* Leading whitespace is never significant, ignore it. */
		while (*p == ' ' || *p == '\t') {
			++p;
			--len;
		}
		/* Skip content lines and blank lines. */
		if (*p == '#')
			continue;
		if (*p == '\r' || *p == '\n' || *p == '\0')
			continue;
		/* Non-printable characters are not allowed */
		for (s = p;s < p + len - 1; s++) {
			if (!isprint((unsigned char)*s)) {
				r = ARCHIVE_FATAL;
				break;
			}
		}
		if (r != ARCHIVE_OK)
			break;
		if (*p != '/') {
			r = process_add_entry(a, mtree, &global, p, len,
			    &last_entry, is_form_d);
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (p[4] != ' ' && p[4] != '\t')
				break;
			r = process_global_set(a, &global, p);
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (p[6] != ' ' && p[6] != '\t')
				break;
			r = process_global_unset(a, &global, p);
		} else
			break;

		if (r != ARCHIVE_OK) {
			free_options(global);
			return r;
		}
	}

	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Can't parse line %ju", counter);
	free_options(global);
	return (ARCHIVE_FATAL);
}